

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  iterator iVar1;
  bool bVar2;
  ostream *poVar3;
  size_type sVar4;
  size_type sVar5;
  _Base_ptr this;
  pointer ppVar6;
  reference ppVar7;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sos::Function_*>
  *function;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sos::Function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sos::Function_*>_>_>
  *__range1;
  allocator<char> local_351;
  key_type local_350;
  _Self local_330;
  iterator main;
  VariableStack *stack;
  undefined1 local_308 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  int local_c;
  
  local_c = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"call",&local_31);
  instruction(&local_30,sos::Instructions::call);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"store",&local_69);
  instruction(&local_68,sos::Instructions::store);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"load",&local_91);
  instruction(&local_90,sos::Instructions::load);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"loadr",&local_b9);
  instruction(&local_b8,sos::Instructions::loadr);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"goto",&local_e1);
  instruction(&local_e0,sos::Instructions::go);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"if",&local_109);
  instruction(&local_108,sos::Instructions::ifelse);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,anon_var_dwarf_75ab,&local_131);
  native(&local_130,sos::NativeFunction::print);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,anon_var_dwarf_75b6,&local_159);
  native(&local_158,sos::NativeFunction::printr);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,anon_var_dwarf_75c1,&local_181);
  native(&local_180,sos::NativeFunction::read);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,anon_var_dwarf_75cc,&local_1a9);
  native(&local_1a8,sos::NativeFunction::kill);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"!",&local_1d1);
  native(&local_1d0,sos::NativeFunction::invert);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"&&",&local_1f9);
  native(&local_1f8,sos::NativeFunction::boolAnd);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"||",&local_221);
  native(&local_220,sos::NativeFunction::boolOr);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"==",&local_249);
  native(&local_248,sos::NativeFunction::equals);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,">",&local_271);
  native(&local_270,sos::NativeFunction::greater);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,">=",&local_299);
  native(&local_298,sos::NativeFunction::greaterEqual);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"<",&local_2c1);
  native(&local_2c0,sos::NativeFunction::less);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"<=",
             (allocator<char> *)
             ((long)&lines.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  native(&local_2e8,sos::NativeFunction::lessEqual);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&lines.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  readFile_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&stack,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_308);
  parseForFunction((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack);
  poVar3 = std::operator<<((ostream *)&std::cout,"Using ");
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*,_sos::VariableStack_*,_int_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*,_sos::VariableStack_*,_int_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>_>_>
          ::size(&instructions_abi_cxx11_);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
  poVar3 = std::operator<<(poVar3," instructions.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Loaded ");
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sos::Function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sos::Function_*>_>_>
          ::size(&sos::Instructions::functions_abi_cxx11_);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar5);
  poVar3 = std::operator<<(poVar3," functions.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  this = (_Base_ptr)operator_new(0x18);
  *(undefined8 *)this = 0;
  this->_M_parent = (_Base_ptr)0x0;
  this->_M_left = (_Base_ptr)0x0;
  sos::VariableStack::VariableStack((VariableStack *)this);
  main._M_node = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,"main",&local_351);
  local_330._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sos::Function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sos::Function_*>_>_>
       ::find(&sos::Instructions::functions_abi_cxx11_,&local_350);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator(&local_351);
  __range1 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sos::Function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sos::Function_*>_>_>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sos::Function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sos::Function_*>_>_>
                ::end(&sos::Instructions::functions_abi_cxx11_);
  bVar2 = std::operator==(&local_330,(_Self *)&__range1);
  if (bVar2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Cannot execute file without main function!");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  ppVar6 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sos::Function_*>_>
           ::operator->(&local_330);
  (**ppVar6->second->_vptr_Function)(ppVar6->second,main._M_node);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sos::Function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sos::Function_*>_>_>
           ::begin(&sos::Instructions::functions_abi_cxx11_);
  function = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sos::Function_*>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sos::Function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sos::Function_*>_>_>
                ::end(&sos::Instructions::functions_abi_cxx11_);
  while (bVar2 = std::operator==(&__end1,(_Self *)&function), iVar1 = main,
        ((bVar2 ^ 0xffU) & 1) != 0) {
    ppVar7 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sos::Function_*>_>
             ::operator*(&__end1);
    if (ppVar7->second != (Function *)0x0) {
      operator_delete(ppVar7->second,8);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sos::Function_*>_>
    ::operator++(&__end1);
  }
  if (main._M_node != (_Base_ptr)0x0) {
    sos::VariableStack::~VariableStack((VariableStack *)main._M_node);
    operator_delete(iVar1._M_node,0x18);
  }
  local_c = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_308);
  return local_c;
}

Assistant:

int main() {
    // Load Instruction Set
    instruction("call", Instructions::call);
    instruction("store", Instructions::store);
    instruction("load", Instructions::load);
    instruction("loadr", Instructions::loadr);
    instruction("goto", Instructions::go);
    instruction("if", Instructions::ifelse);

    // Load Native Functions
    native("🖨", NativeFunction::print);
    native("📄", NativeFunction::printr);
    native("💬", NativeFunction::read);
    native("💀", NativeFunction::kill);
    native("!", NativeFunction::invert);
    native("&&", NativeFunction::boolAnd);
    native("||", NativeFunction::boolOr);
    native("==", NativeFunction::equals);
    native(">", NativeFunction::greater);
    native(">=", NativeFunction::greaterEqual);
    native("<", NativeFunction::less);
    native("<=", NativeFunction::lessEqual);


    std::vector<std::string> lines = readFile();
    parseForFunction(lines);

    if (DEBUG) {
        std::cout << "Using " << instructions.size() << " instructions." << std::endl;
        std::cout << "Loaded " << Instructions::functions.size() << " functions." << std::endl;
    }

    auto* stack = new VariableStack();

    auto main = Instructions::functions.find("main");
    if (main == Instructions::functions.end())
        std::cerr << "Cannot execute file without main function!" << std::endl;
    main->second->execute(stack);

    // Deallocate functions
    for(auto & function : Instructions::functions)
        delete function.second;
    delete stack;
    return 0;
}